

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::SourceCodeInfo_Location::SourceCodeInfo_Location
          (SourceCodeInfo_Location *this,SourceCodeInfo_Location *from)

{
  InternalMetadataWithArena *this_00;
  void *pvVar1;
  uint uVar2;
  Arena *pAVar3;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__SourceCodeInfo_Location_0060f3f0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  this_00 = &this->_internal_metadata_;
  RepeatedField<int>::RepeatedField(&this->path_,&from->path_);
  RepeatedField<int>::RepeatedField(&this->span_,&from->span_);
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::RepeatedPtrField(&this->leading_detached_comments_,&from->leading_detached_comments_);
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    internal::InternalMetadataWithArena::DoMergeFrom
              (this_00,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  (this->leading_comments_).ptr_ = (string *)internal::fixed_address_empty_string_abi_cxx11_;
  uVar2 = (from->_has_bits_).has_bits_[0];
  if ((uVar2 & 1) != 0) {
    pAVar3 = (Arena *)(this_00->
                      super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                      ).ptr_;
    if (((ulong)pAVar3 & 1) != 0) {
      pAVar3 = *(Arena **)(((ulong)pAVar3 & 0xfffffffffffffffe) + 0x18);
    }
    internal::ArenaStringPtr::Set
              (&this->leading_comments_,(string *)internal::fixed_address_empty_string_abi_cxx11_,
               (from->leading_comments_).ptr_,pAVar3);
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  (this->trailing_comments_).ptr_ = (string *)internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar2 & 2) != 0) {
    pAVar3 = (Arena *)(this_00->
                      super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                      ).ptr_;
    if (((ulong)pAVar3 & 1) != 0) {
      pAVar3 = *(Arena **)(((ulong)pAVar3 & 0xfffffffffffffffe) + 0x18);
    }
    internal::ArenaStringPtr::Set
              (&this->trailing_comments_,(string *)internal::fixed_address_empty_string_abi_cxx11_,
               (from->trailing_comments_).ptr_,pAVar3);
  }
  return;
}

Assistant:

SourceCodeInfo_Location::SourceCodeInfo_Location(const SourceCodeInfo_Location& from)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
      _internal_metadata_(nullptr),
      _has_bits_(from._has_bits_),
      path_(from.path_),
      span_(from.span_),
      leading_detached_comments_(from.leading_detached_comments_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  leading_comments_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_leading_comments()) {
    leading_comments_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_leading_comments(),
      GetArenaNoVirtual());
  }
  trailing_comments_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_trailing_comments()) {
    trailing_comments_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_trailing_comments(),
      GetArenaNoVirtual());
  }
  // @@protoc_insertion_point(copy_constructor:google.protobuf.SourceCodeInfo.Location)
}